

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O0

void lws_dll2_add_before(lws_dll2 *d,lws_dll2 *after)

{
  lws_dll2_owner *plVar1;
  int iVar2;
  lws_dll2_owner_t *owner;
  lws_dll2 *after_local;
  lws_dll2 *d_local;
  
  plVar1 = after->owner;
  iVar2 = lws_dll2_is_detached(d);
  if (iVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                  ,0x51,"void lws_dll2_add_before(struct lws_dll2 *, struct lws_dll2 *)");
  }
  iVar2 = lws_dll2_is_detached(after);
  if (iVar2 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                  ,0x56,"void lws_dll2_add_before(struct lws_dll2 *, struct lws_dll2 *)");
  }
  d->owner = plVar1;
  d->next = after;
  d->prev = after->prev;
  if (after->prev == (lws_dll2 *)0x0) {
    plVar1->head = d;
  }
  else {
    after->prev->next = d;
  }
  after->prev = d;
  plVar1->count = plVar1->count + 1;
  return;
}

Assistant:

void
lws_dll2_add_before(struct lws_dll2 *d, struct lws_dll2 *after)
{
	lws_dll2_owner_t *owner = after->owner;

	if (!lws_dll2_is_detached(d)) {
		assert(0); /* only wholly detached things can be added */
		return;
	}

	if (lws_dll2_is_detached(after)) {
		assert(0); /* can't add after something detached */
		return;
	}

	d->owner = owner;

	/* we need to point forward to after */

	d->next = after;

	/* we need to point back to after->prev */

	d->prev = after->prev;

	/* guy that used to point to after, needs to point to us */

	if (after->prev)
		after->prev->next = d;
	else
		owner->head = d;

	/* then after needs to point back to us */

	after->prev = d;

	owner->count++;
}